

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall
cmCTest::HandleTestActionArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  pointer pbVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  bool bVar6;
  cmCTest *this_00;
  char *local_1e8 [4];
  string arg;
  ostringstream cmCTestLog_msg;
  
  this_00 = (cmCTest *)&arg;
  std::__cxx11::string::string
            ((string *)&arg,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + *i));
  bVar3 = CheckArgument(this_00,&arg,"-T","--test-action");
  bVar6 = true;
  if (bVar3) {
    uVar1 = *i;
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar1 < ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
      this->ProduceXML = true;
      sVar4 = uVar1 + 1;
      *i = sVar4;
      bVar3 = SetTest(this,pbVar2[sVar4]._M_dataplus._M_p,false);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "CTest -T called with incorrect option: ");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + *i));
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x868,local_1e8[0],false);
        std::__cxx11::string::~string((string *)local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Available options are:");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,ctestExec);
        poVar5 = std::operator<<(poVar5," -T all");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,ctestExec);
        poVar5 = std::operator<<(poVar5," -T start");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,ctestExec);
        poVar5 = std::operator<<(poVar5," -T update");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,ctestExec);
        poVar5 = std::operator<<(poVar5," -T configure");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,ctestExec);
        poVar5 = std::operator<<(poVar5," -T build");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,ctestExec);
        poVar5 = std::operator<<(poVar5," -T test");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,ctestExec);
        poVar5 = std::operator<<(poVar5," -T coverage");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,ctestExec);
        poVar5 = std::operator<<(poVar5," -T memcheck");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,ctestExec);
        poVar5 = std::operator<<(poVar5," -T notes");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,"  ");
        poVar5 = std::operator<<(poVar5,ctestExec);
        poVar5 = std::operator<<(poVar5," -T submit");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x874,local_1e8[0],false);
        std::__cxx11::string::~string((string *)local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        bVar6 = false;
      }
    }
  }
  std::__cxx11::string::~string((string *)&arg);
  return bVar6;
}

Assistant:

bool cmCTest::HandleTestActionArgument(const char* ctestExec, size_t& i,
                                       const std::vector<std::string>& args)
{
  bool success = true;
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-T", "--test-action") &&
      (i < args.size() - 1)) {
    this->ProduceXML = true;
    i++;
    if (!this->SetTest(args[i].c_str(), false)) {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE, "CTest -T called with incorrect option: "
                   << args[i] << std::endl);
      cmCTestLog(this, ERROR_MESSAGE, "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -T all" << std::endl
                   << "  " << ctestExec << " -T start" << std::endl
                   << "  " << ctestExec << " -T update" << std::endl
                   << "  " << ctestExec << " -T configure" << std::endl
                   << "  " << ctestExec << " -T build" << std::endl
                   << "  " << ctestExec << " -T test" << std::endl
                   << "  " << ctestExec << " -T coverage" << std::endl
                   << "  " << ctestExec << " -T memcheck" << std::endl
                   << "  " << ctestExec << " -T notes" << std::endl
                   << "  " << ctestExec << " -T submit" << std::endl);
    }
  }
  return success;
}